

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

void __thiscall spv::Builder::~Builder(Builder *this)

{
  long lVar1;
  
  this->_vptr_Builder = (_func_int **)&PTR__Builder_001f8cf8;
  std::
  _Destroy<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>,unsigned_int>*,dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>,unsigned_int>>>
            ((this->importIDCache).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->importIDCache).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_unsigned_int>_>
              *)&this->importIDCache);
  std::
  _Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_unsigned_int>_>_>
  ::~_Vector_base(&(this->importIDCache).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_unsigned_int>_>_>
                 );
  std::_Deque_base<spv::Builder::LoopBlocks,_std::allocator<spv::Builder::LoopBlocks>_>::
  ~_Deque_base((_Deque_base<spv::Builder::LoopBlocks,_std::allocator<spv::Builder::LoopBlocks>_> *)
               &this->loops);
  std::_Deque_base<spv::Block_*,_std::allocator<spv::Block_*>_>::~_Deque_base
            ((_Deque_base<spv::Block_*,_std::allocator<spv::Block_*>_> *)&this->switchMerges);
  std::_Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::
  ~_Vector_base(&(this->coopmatTypes).
                 super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
               );
  std::_Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::
  ~_Vector_base(&(this->coopmatConstants).
                 super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
               );
  lVar1 = 0xa70;
  do {
    std::_Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::
    ~_Vector_base((_Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                   *)((long)&this->_vptr_Builder + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != 0x668);
  lVar1 = 0x668;
  do {
    std::_Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::
    ~_Vector_base((_Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                   *)((long)&this->_vptr_Builder + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != 0x260);
  std::
  vector<std::unique_ptr<spv::Function,_std::default_delete<spv::Function>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Function,_std::default_delete<spv::Function>_>_>_>
  ::~vector(&this->functions);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::~vector(&this->externals);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::~vector(&this->constantsTypesGlobals);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::~vector(&this->decorations);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::~vector(&this->lines);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::~vector(&this->names);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::~vector(&this->executionModes);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::~vector(&this->entryPoints);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::~vector(&this->imports);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::~vector(&this->strings);
  std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
            (&(this->accessChain).swizzle.
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
            (&(this->accessChain).indexChain.
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>);
  (this->module)._vptr_Module = (_func_int **)&PTR__Module_001f8d38;
  std::_Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::
  ~_Vector_base(&(this->module).idToInstruction.
                 super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
               );
  std::_Vector_base<spv::Function_*,_dxil_spv::ThreadLocalAllocator<spv::Function_*>_>::
  ~_Vector_base(&(this->module).functions.
                 super__Vector_base<spv::Function_*,_dxil_spv::ThreadLocalAllocator<spv::Function_*>_>
               );
  std::
  _Rb_tree<spv::Capability,_spv::Capability,_std::_Identity<spv::Capability>,_std::less<spv::Capability>,_dxil_spv::ThreadLocalAllocator<spv::Capability>_>
  ::~_Rb_tree(&(this->capabilities)._M_t);
  std::_Vector_base<const_char_*,_dxil_spv::ThreadLocalAllocator<const_char_*>_>::~_Vector_base
            (&(this->moduleProcesses).
              super__Vector_base<const_char_*,_dxil_spv::ThreadLocalAllocator<const_char_*>_>);
  std::_Vector_base<const_char_*,_dxil_spv::ThreadLocalAllocator<const_char_*>_>::~_Vector_base
            (&(this->sourceExtensions).
              super__Vector_base<const_char_*,_dxil_spv::ThreadLocalAllocator<const_char_*>_>);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
  ::~_Rb_tree(&(this->extensions)._M_t);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  _M_dispose(&this->sourceText);
  return;
}

Assistant:

Builder::~Builder()
{
}